

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# earcut.hpp
# Opt level: O1

Node * __thiscall
mapbox::detail::Earcut<unsigned_int>::
ObjectPool<mapbox::detail::Earcut<unsigned_int>::Node,std::allocator<mapbox::detail::Earcut<unsigned_int>::Node>>
::construct<unsigned_int_const&,double_const&,double_const&>
          (ObjectPool<mapbox::detail::Earcut<unsigned_int>::Node,std::allocator<mapbox::detail::Earcut<unsigned_int>::Node>>
           *this,uint *args,double *args_1,double *args_2)

{
  double dVar1;
  double dVar2;
  iterator __position;
  long lVar3;
  Node *pNVar4;
  
  if (*(ulong *)(this + 0x10) <= *(ulong *)(this + 8)) {
    pNVar4 = __gnu_cxx::new_allocator<mapbox::detail::Earcut<unsigned_int>::Node>::allocate
                       ((new_allocator<mapbox::detail::Earcut<unsigned_int>::Node> *)(this + 0x30),
                        *(ulong *)(this + 0x10),(void *)0x0);
    *(Node **)this = pNVar4;
    __position._M_current = *(Node ***)(this + 0x20);
    if (__position._M_current == *(Node ***)(this + 0x28)) {
      std::
      vector<mapbox::detail::Earcut<unsigned_int>::Node*,std::allocator<mapbox::detail::Earcut<unsigned_int>::Node*>>
      ::_M_realloc_insert<mapbox::detail::Earcut<unsigned_int>::Node*&>
                ((vector<mapbox::detail::Earcut<unsigned_int>::Node*,std::allocator<mapbox::detail::Earcut<unsigned_int>::Node*>>
                  *)(this + 0x18),__position,(Node **)this);
    }
    else {
      *__position._M_current = pNVar4;
      *(long *)(this + 0x20) = *(long *)(this + 0x20) + 8;
    }
    *(undefined8 *)(this + 8) = 0;
  }
  lVar3 = *(long *)(this + 8);
  *(long *)(this + 8) = lVar3 + 1;
  pNVar4 = (Node *)(*(long *)this + lVar3 * 0x48);
  dVar1 = *args_1;
  dVar2 = *args_2;
  pNVar4->i = *args;
  pNVar4->x = dVar1;
  pNVar4->y = dVar2;
  pNVar4->prev = (Node *)0x0;
  pNVar4->next = (Node *)0x0;
  pNVar4->z = 0;
  pNVar4->prevZ = (Node *)0x0;
  pNVar4->nextZ = (Node *)0x0;
  pNVar4->steiner = false;
  return pNVar4;
}

Assistant:

T* construct(Args&&... args) {
            if (currentIndex >= blockSize) {
                currentBlock = alloc_traits::allocate(alloc, blockSize);
                allocations.emplace_back(currentBlock);
                currentIndex = 0;
            }
            T* object = &currentBlock[currentIndex++];
            alloc_traits::construct(alloc, object, std::forward<Args>(args)...);
            return object;
        }